

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS
ref_gather_scalar_cell_restart_sol(REF_GRID ref_grid,REF_INT ldim,REF_DBL *scalar,char *filename)

{
  REF_STATUS RVar1;
  FILE *__stream;
  double local_f0;
  REF_DBL p;
  REF_DBL v;
  REF_DBL u;
  REF_DBL rho;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_INT local_b8;
  REF_INT cell_node;
  REF_INT nodes [27];
  REF_INT cell;
  REF_CELL ref_cell;
  REF_MPI ref_mpi;
  FILE *file;
  char *filename_local;
  REF_DBL *scalar_local;
  REF_INT ldim_local;
  REF_GRID ref_grid_local;
  
  unique0x00012000 = ref_grid->cell[3];
  if (ref_grid->mpi->n < 2) {
    if ((long)ldim == 5) {
      __stream = fopen(filename,"w");
      if (__stream == (FILE *)0x0) {
        printf("unable to open %s\n",filename);
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xc1b,"ref_gather_scalar_cell_restart_sol","unable to open file");
        ref_grid_local._4_4_ = 2;
      }
      else {
        fprintf(__stream,"%d\n",(ulong)(uint)stack0xffffffffffffffb8->n);
        for (nodes[0x19] = 0; nodes[0x19] < stack0xffffffffffffffb8->max;
            nodes[0x19] = nodes[0x19] + 1) {
          RVar1 = ref_cell_nodes(stack0xffffffffffffffb8,nodes[0x19],&local_b8);
          if (RVar1 == 0) {
            u = 0.0;
            v = 0.0;
            p = 0.0;
            local_f0 = 0.0;
            for (ref_private_status_reis_ai._4_4_ = 0;
                ref_private_status_reis_ai._4_4_ < stack0xffffffffffffffb8->node_per;
                ref_private_status_reis_ai._4_4_ = ref_private_status_reis_ai._4_4_ + 1) {
              u = scalar[ldim * (&local_b8)[ref_private_status_reis_ai._4_4_]] + u;
              v = scalar[ldim * (&local_b8)[ref_private_status_reis_ai._4_4_] + 1] + v;
              p = scalar[ldim * (&local_b8)[ref_private_status_reis_ai._4_4_] + 3] + p;
              local_f0 = scalar[ldim * (&local_b8)[ref_private_status_reis_ai._4_4_] + 4] + local_f0
              ;
            }
            fprintf(__stream,"%.15e %.15e %.15e %.15e\n",
                    u / (double)stack0xffffffffffffffb8->node_per,
                    v / (double)stack0xffffffffffffffb8->node_per,
                    p / (double)stack0xffffffffffffffb8->node_per,
                    local_f0 / (double)stack0xffffffffffffffb8->node_per);
          }
        }
        fclose(__stream);
        ref_grid_local._4_4_ = 0;
      }
    }
    else {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0xc17,"ref_gather_scalar_cell_restart_sol","only implemented for ldim=5",5,(long)ldim);
      ref_grid_local._4_4_ = 1;
    }
  }
  else {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0xc16,
           "ref_gather_scalar_cell_restart_sol","only implemented for single core");
    ref_grid_local._4_4_ = 1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_scalar_cell_restart_sol(
    REF_GRID ref_grid, REF_INT ldim, REF_DBL *scalar, const char *filename) {
  FILE *file;
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER], cell_node;

  RAS(!ref_mpi_para(ref_mpi), "only implemented for single core");
  REIS(5, ldim, "only implemented for ldim=5");

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "%d\n", ref_cell_n(ref_cell));

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    REF_DBL rho, u, v, p;
    rho = 0;
    u = 0;
    v = 0;
    p = 0;
    each_ref_cell_cell_node(ref_cell, cell_node) {
      rho += scalar[0 + ldim * nodes[cell_node]];
      u += scalar[1 + ldim * nodes[cell_node]];
      v += scalar[3 + ldim * nodes[cell_node]];
      p += scalar[4 + ldim * nodes[cell_node]];
    }
    rho /= (REF_DBL)ref_cell_node_per(ref_cell);
    u /= (REF_DBL)ref_cell_node_per(ref_cell);
    v /= (REF_DBL)ref_cell_node_per(ref_cell);
    p /= (REF_DBL)ref_cell_node_per(ref_cell);
    fprintf(file, "%.15e %.15e %.15e %.15e\n", rho, u, v, p);
  }

  fclose(file);

  return REF_SUCCESS;
}